

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_9d1d6::EdgeClippingLayer::Build(EdgeClippingLayer *this,Graph *g,S2Error *error)

{
  pointer *this_00;
  vector<signed_char,_std::allocator<signed_char>_> *this_01;
  GraphOptions *pGVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  pointer pLVar7;
  ulong uVar8;
  const_reference pvVar9;
  long lVar10;
  reference pvVar11;
  pointer *local_508;
  pointer *local_4f0;
  GraphOptions *local_4a8;
  bool *local_490;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_478;
  Graph local_408;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390;
  int local_38c;
  undefined1 local_388 [4];
  int d_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_370;
  int local_358;
  int local_354;
  int d;
  int i_1;
  vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> layer_graphs;
  GraphOptions layer_options [3];
  vector<int,_std::allocator<int>_> layer_input_edge_ids [3];
  undefined1 local_2a8 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> layer_edges [3];
  S2LogMessage local_258;
  S2LogMessageVoidify local_241;
  undefined1 local_240 [8];
  Graph new_graph;
  GraphOptions options;
  IdSetLexicon new_input_edge_id_set_lexicon;
  int i;
  GraphEdgeClipper local_100;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> new_input_edge_ids;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> new_edges;
  S2Error *error_local;
  Graph *g_local;
  EdgeClippingLayer *this_local;
  
  this_00 = &new_input_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
  GraphEdgeClipper::GraphEdgeClipper
            (&local_100,g,this->input_dimensions_,this->input_crossings_,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00,
             (vector<int,_std::allocator<int>_> *)local_50);
  GraphEdgeClipper::Run(&local_100);
  GraphEdgeClipper::~GraphEdgeClipper(&local_100);
  if ((s2builder_verbose & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Edges after clipping: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (new_input_edge_id_set_lexicon.tmp_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           &new_input_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage),
        (ulong)(long)(int)new_input_edge_id_set_lexicon.tmp_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage < sVar3;
        new_input_edge_id_set_lexicon.tmp_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)new_input_edge_id_set_lexicon.tmp_.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  ");
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_50,
                          (long)(int)new_input_edge_id_set_lexicon.tmp_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
      poVar2 = std::operator<<(poVar2," (");
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &new_input_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (long)(int)new_input_edge_id_set_lexicon.tmp_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar5->first);
      poVar2 = std::operator<<(poVar2,", ");
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &new_input_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (long)(int)new_input_edge_id_set_lexicon.tmp_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar5->second);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  IdSetLexicon::IdSetLexicon((IdSetLexicon *)&options.sibling_pairs_);
  sVar3 = std::
          vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
          ::size(this->layers_);
  if (sVar3 == 1) {
    pvVar6 = std::
             vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
             ::operator[](this->layers_,0);
    pLVar7 = std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::operator->
                       (pvVar6);
    (*pLVar7->_vptr_Layer[2])
              ((undefined1 *)((long)&new_graph.is_full_polygon_predicate_._M_invoker + 4));
    MakeGraph((Graph *)local_240,g,
              (GraphOptions *)((long)&new_graph.is_full_polygon_predicate_._M_invoker + 4),
              (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
              &new_input_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
              (vector<int,_std::allocator<int>_> *)local_50,(IdSetLexicon *)&options.sibling_pairs_,
              error);
    pvVar6 = std::
             vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
             ::operator[](this->layers_,0);
    pLVar7 = std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::operator->
                       (pvVar6);
    (*pLVar7->_vptr_Layer[3])(pLVar7,local_240,error);
    S2Builder::Graph::~Graph((Graph *)local_240);
  }
  else {
    sVar3 = std::
            vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
            ::size(this->layers_);
    layer_edges[2].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    if (sVar3 != 3) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_258,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0x30a,kFatal,(ostream *)&std::cerr);
      layer_edges[2].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      poVar2 = S2LogMessage::stream(&local_258);
      poVar2 = std::operator<<(poVar2,"Check failed: (3) == (layers_.size()) ");
      S2LogMessageVoidify::operator&(&local_241,poVar2);
    }
    if ((layer_edges[2].
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_258);
    }
    local_478 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_2a8;
    do {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(local_478);
      local_478 = local_478 + 1;
    } while (local_478 !=
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &layer_edges[2].
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
    local_490 = &layer_options[2].allow_vertex_filtering_;
    do {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_490)
      ;
      local_490 = local_490 + 0x18;
    } while ((pointer *)local_490 !=
             &layer_input_edge_ids[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    local_4a8 = (GraphOptions *)
                &layer_graphs.
                 super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    do {
      S2Builder::GraphOptions::GraphOptions(local_4a8);
      local_4a8 = local_4a8 + 1;
    } while (local_4a8 != (GraphOptions *)&layer_options[2].sibling_pairs_);
    std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::vector
              ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)&d);
    std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::reserve
              ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)&d,3);
    for (local_354 = 0; uVar8 = (ulong)local_354,
        sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           &new_input_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage), uVar8 < sVar3;
        local_354 = local_354 + 1) {
      this_01 = this->input_dimensions_;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_50,(long)local_354);
      pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (this_01,(long)*pvVar4);
      local_358 = (int)*pvVar9;
      lVar10 = (long)local_358;
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &new_input_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_354);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &layer_edges[lVar10 + -1].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar5);
      lVar10 = (long)local_358;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_50,(long)local_354);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)((long)layer_options + lVar10 * 0x18 + 0x38),
                 pvVar4);
    }
    memset(&local_370,0,0x18);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(&local_370);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::swap
              (&local_370,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &new_input_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_370);
    memset(local_388,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_388);
    std::vector<int,_std::allocator<int>_>::swap
              ((vector<int,_std::allocator<int>_> *)local_388,
               (vector<int,_std::allocator<int>_> *)local_50);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_388);
    for (local_38c = 0; local_38c < 3; local_38c = local_38c + 1) {
      pvVar6 = std::
               vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
               ::operator[](this->layers_,(long)local_38c);
      pLVar7 = std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::operator->
                         (pvVar6);
      (*pLVar7->_vptr_Layer[2])(&local_3a0);
      lVar10 = (long)local_38c;
      *(undefined1 *)&layer_options[lVar10].duplicate_edges_ = local_390;
      pGVar1 = layer_options + lVar10 + -1;
      pGVar1->sibling_pairs_ = (undefined4)local_3a0;
      pGVar1->allow_vertex_filtering_ = (bool)local_3a0._4_1_;
      *(undefined3 *)&pGVar1->field_0x11 = local_3a0._5_3_;
      layer_options[lVar10].edge_type_ = (undefined4)uStack_398;
      layer_options[lVar10].degenerate_edges_ = uStack_398._4_4_;
      lVar10 = (long)local_38c;
      MakeGraph(&local_408,g,(GraphOptions *)&layer_options[lVar10 + -1].sibling_pairs_,
                (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &layer_edges[lVar10 + -1].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<int,_std::allocator<int>_> *)((long)layer_options + lVar10 * 0x18 + 0x38),
                (IdSetLexicon *)&options.sibling_pairs_,error);
      std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::push_back
                ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)&d,&local_408);
      S2Builder::Graph::~Graph(&local_408);
      pvVar6 = std::
               vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
               ::operator[](this->layers_,(long)local_38c);
      pLVar7 = std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::operator->
                         (pvVar6);
      pvVar11 = std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::operator[]
                          ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)&d,
                           (long)local_38c);
      (*pLVar7->_vptr_Layer[3])(pLVar7,pvVar11,error);
    }
    std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::~vector
              ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)&d);
    local_4f0 = &layer_input_edge_ids[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    do {
      local_4f0 = local_4f0 + -3;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_4f0);
    } while (local_4f0 != (pointer *)&layer_options[2].allow_vertex_filtering_);
    local_508 = &layer_edges[2].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_508 = local_508 + -3;
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_508);
    } while (local_508 != (pointer *)local_2a8);
  }
  IdSetLexicon::~IdSetLexicon((IdSetLexicon *)&options.sibling_pairs_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &new_input_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void EdgeClippingLayer::Build(const Graph& g, S2Error* error) {
  // The bulk of the work is handled by GraphEdgeClipper.
  vector<Graph::Edge> new_edges;
  vector<InputEdgeIdSetId> new_input_edge_ids;
  // Destroy the GraphEdgeClipper immediately to save memory.
  GraphEdgeClipper(g, input_dimensions_, input_crossings_,
                   &new_edges, &new_input_edge_ids).Run();
  if (s2builder_verbose) {
    std::cout << "Edges after clipping: " << std::endl;
    for (int i = 0; i < new_edges.size(); ++i) {
      std::cout << "  " << new_input_edge_ids[i] << " (" << new_edges[i].first
                << ", " << new_edges[i].second << ")" << std::endl;
    }
  }
  // Construct one or more graphs from the clipped edges and pass them to the
  // given output layer(s).
  IdSetLexicon new_input_edge_id_set_lexicon;
  if (layers_.size() == 1) {
    GraphOptions options = layers_[0]->graph_options();
    Graph new_graph = MakeGraph(g, &options, &new_edges, &new_input_edge_ids,
                                &new_input_edge_id_set_lexicon, error);
    layers_[0]->Build(new_graph, error);
  } else {
    // The Graph objects must be valid until the last Build() call completes,
    // so we store all of the graph data in arrays with 3 elements.
    S2_DCHECK_EQ(3, layers_.size());
    vector<Graph::Edge> layer_edges[3];
    vector<InputEdgeIdSetId> layer_input_edge_ids[3];
    S2Builder::GraphOptions layer_options[3];
    vector<S2Builder::Graph> layer_graphs;  // No default constructor.
    layer_graphs.reserve(3);
    // Separate the edges according to their dimension.
    for (int i = 0; i < new_edges.size(); ++i) {
      int d = input_dimensions_[new_input_edge_ids[i]];
      layer_edges[d].push_back(new_edges[i]);
      layer_input_edge_ids[d].push_back(new_input_edge_ids[i]);
    }
    // Clear variables to save space.
    vector<Graph::Edge>().swap(new_edges);
    vector<InputEdgeIdSetId>().swap(new_input_edge_ids);
    for (int d = 0; d < 3; ++d) {
      layer_options[d] = layers_[d]->graph_options();
      layer_graphs.push_back(MakeGraph(
          g, &layer_options[d], &layer_edges[d], &layer_input_edge_ids[d],
          &new_input_edge_id_set_lexicon, error));
      layers_[d]->Build(layer_graphs[d], error);
    }
  }
}